

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__vertical_gather_with_7_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  long lVar123;
  long lVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  
  pfVar11 = *inputs;
  pfVar12 = inputs[1];
  fVar10 = *vertical_coefficients;
  pfVar13 = inputs[2];
  fVar127 = (float)*(undefined8 *)(vertical_coefficients + 1);
  fVar128 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 1) >> 0x20);
  pfVar14 = inputs[3];
  pfVar15 = inputs[4];
  fVar129 = (float)*(undefined8 *)(vertical_coefficients + 3);
  fVar130 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 3) >> 0x20);
  pfVar16 = inputs[5];
  pfVar17 = inputs[6];
  fVar125 = (float)*(undefined8 *)(vertical_coefficients + 5);
  fVar126 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 5) >> 0x20);
  lVar123 = 0;
  for (lVar124 = (long)input0_end - (long)pfVar11; 0x3f < lVar124; lVar124 = lVar124 + -0x40) {
    pfVar1 = (float *)((long)outputp + lVar123);
    pfVar2 = (float *)((long)pfVar11 + lVar123);
    fVar18 = pfVar2[1];
    fVar19 = pfVar2[2];
    fVar20 = pfVar2[3];
    pfVar3 = (float *)((long)pfVar11 + lVar123 + 0x10);
    fVar21 = *pfVar3;
    fVar22 = pfVar3[1];
    fVar23 = pfVar3[2];
    fVar24 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar11 + lVar123 + 0x20);
    fVar25 = *pfVar3;
    fVar26 = pfVar3[1];
    fVar27 = pfVar3[2];
    fVar28 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar11 + lVar123 + 0x30);
    fVar29 = *pfVar3;
    fVar30 = pfVar3[1];
    fVar31 = pfVar3[2];
    fVar32 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar12 + lVar123);
    fVar33 = pfVar3[1];
    fVar34 = pfVar3[2];
    fVar35 = pfVar3[3];
    pfVar4 = (float *)((long)pfVar12 + lVar123 + 0x10);
    fVar36 = *pfVar4;
    fVar37 = pfVar4[1];
    fVar38 = pfVar4[2];
    fVar39 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar12 + lVar123 + 0x20);
    fVar40 = *pfVar4;
    fVar41 = pfVar4[1];
    fVar42 = pfVar4[2];
    fVar43 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar12 + lVar123 + 0x30);
    fVar44 = *pfVar4;
    fVar45 = pfVar4[1];
    fVar46 = pfVar4[2];
    fVar47 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar13 + lVar123);
    fVar48 = pfVar4[1];
    fVar49 = pfVar4[2];
    fVar50 = pfVar4[3];
    pfVar5 = (float *)((long)pfVar13 + lVar123 + 0x10);
    fVar51 = *pfVar5;
    fVar52 = pfVar5[1];
    fVar53 = pfVar5[2];
    fVar54 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar13 + lVar123 + 0x20);
    fVar55 = *pfVar5;
    fVar56 = pfVar5[1];
    fVar57 = pfVar5[2];
    fVar58 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar13 + lVar123 + 0x30);
    fVar59 = *pfVar5;
    fVar60 = pfVar5[1];
    fVar61 = pfVar5[2];
    fVar62 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar14 + lVar123);
    fVar63 = pfVar5[1];
    fVar64 = pfVar5[2];
    fVar65 = pfVar5[3];
    pfVar6 = (float *)((long)pfVar14 + lVar123 + 0x10);
    fVar66 = *pfVar6;
    fVar67 = pfVar6[1];
    fVar68 = pfVar6[2];
    fVar69 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar14 + lVar123 + 0x20);
    fVar70 = *pfVar6;
    fVar71 = pfVar6[1];
    fVar72 = pfVar6[2];
    fVar73 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar14 + lVar123 + 0x30);
    fVar74 = *pfVar6;
    fVar75 = pfVar6[1];
    fVar76 = pfVar6[2];
    fVar77 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar15 + lVar123);
    fVar78 = pfVar6[1];
    fVar79 = pfVar6[2];
    fVar80 = pfVar6[3];
    pfVar7 = (float *)((long)pfVar15 + lVar123 + 0x10);
    fVar81 = *pfVar7;
    fVar82 = pfVar7[1];
    fVar83 = pfVar7[2];
    fVar84 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar15 + lVar123 + 0x20);
    fVar85 = *pfVar7;
    fVar86 = pfVar7[1];
    fVar87 = pfVar7[2];
    fVar88 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar15 + lVar123 + 0x30);
    fVar89 = *pfVar7;
    fVar90 = pfVar7[1];
    fVar91 = pfVar7[2];
    fVar92 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar16 + lVar123);
    fVar93 = pfVar7[1];
    fVar94 = pfVar7[2];
    fVar95 = pfVar7[3];
    pfVar8 = (float *)((long)pfVar16 + lVar123 + 0x10);
    fVar96 = *pfVar8;
    fVar97 = pfVar8[1];
    fVar98 = pfVar8[2];
    fVar99 = pfVar8[3];
    pfVar8 = (float *)((long)pfVar16 + lVar123 + 0x20);
    fVar100 = *pfVar8;
    fVar101 = pfVar8[1];
    fVar102 = pfVar8[2];
    fVar103 = pfVar8[3];
    pfVar8 = (float *)((long)pfVar16 + lVar123 + 0x30);
    fVar104 = *pfVar8;
    fVar105 = pfVar8[1];
    fVar106 = pfVar8[2];
    fVar107 = pfVar8[3];
    pfVar8 = (float *)((long)pfVar17 + lVar123);
    fVar108 = pfVar8[1];
    fVar109 = pfVar8[2];
    fVar110 = pfVar8[3];
    pfVar9 = (float *)((long)pfVar17 + lVar123 + 0x10);
    fVar111 = *pfVar9;
    fVar112 = pfVar9[1];
    fVar113 = pfVar9[2];
    fVar114 = pfVar9[3];
    pfVar9 = (float *)((long)pfVar17 + lVar123 + 0x20);
    fVar115 = *pfVar9;
    fVar116 = pfVar9[1];
    fVar117 = pfVar9[2];
    fVar118 = pfVar9[3];
    pfVar9 = (float *)((long)pfVar17 + lVar123 + 0x30);
    fVar119 = *pfVar9;
    fVar120 = pfVar9[1];
    fVar121 = pfVar9[2];
    fVar122 = pfVar9[3];
    *pfVar1 = *pfVar8 * fVar126 +
              *pfVar7 * fVar125 +
              *pfVar6 * fVar130 +
              *pfVar5 * fVar129 + *pfVar4 * fVar128 + *pfVar3 * fVar127 + *pfVar2 * fVar10 + *pfVar1
    ;
    pfVar1[1] = fVar108 * fVar126 +
                fVar93 * fVar125 +
                fVar78 * fVar130 +
                fVar63 * fVar129 + fVar48 * fVar128 + fVar33 * fVar127 + fVar18 * fVar10 + pfVar1[1]
    ;
    pfVar1[2] = fVar109 * fVar126 +
                fVar94 * fVar125 +
                fVar79 * fVar130 +
                fVar64 * fVar129 + fVar49 * fVar128 + fVar34 * fVar127 + fVar19 * fVar10 + pfVar1[2]
    ;
    pfVar1[3] = fVar110 * fVar126 +
                fVar95 * fVar125 +
                fVar80 * fVar130 +
                fVar65 * fVar129 + fVar50 * fVar128 + fVar35 * fVar127 + fVar20 * fVar10 + pfVar1[3]
    ;
    pfVar1[4] = fVar111 * fVar126 +
                fVar96 * fVar125 +
                fVar81 * fVar130 +
                fVar66 * fVar129 + fVar51 * fVar128 + fVar36 * fVar127 + fVar21 * fVar10 + pfVar1[4]
    ;
    pfVar1[5] = fVar112 * fVar126 +
                fVar97 * fVar125 +
                fVar82 * fVar130 +
                fVar67 * fVar129 + fVar52 * fVar128 + fVar37 * fVar127 + fVar22 * fVar10 + pfVar1[5]
    ;
    pfVar1[6] = fVar113 * fVar126 +
                fVar98 * fVar125 +
                fVar83 * fVar130 +
                fVar68 * fVar129 + fVar53 * fVar128 + fVar38 * fVar127 + fVar23 * fVar10 + pfVar1[6]
    ;
    pfVar1[7] = fVar114 * fVar126 +
                fVar99 * fVar125 +
                fVar84 * fVar130 +
                fVar69 * fVar129 + fVar54 * fVar128 + fVar39 * fVar127 + fVar24 * fVar10 + pfVar1[7]
    ;
    pfVar1[8] = fVar115 * fVar126 +
                fVar100 * fVar125 +
                fVar85 * fVar130 +
                fVar70 * fVar129 + fVar55 * fVar128 + fVar40 * fVar127 + fVar25 * fVar10 + pfVar1[8]
    ;
    pfVar1[9] = fVar116 * fVar126 +
                fVar101 * fVar125 +
                fVar86 * fVar130 +
                fVar71 * fVar129 + fVar56 * fVar128 + fVar41 * fVar127 + fVar26 * fVar10 + pfVar1[9]
    ;
    pfVar1[10] = fVar117 * fVar126 +
                 fVar102 * fVar125 +
                 fVar87 * fVar130 +
                 fVar72 * fVar129 +
                 fVar57 * fVar128 + fVar42 * fVar127 + fVar27 * fVar10 + pfVar1[10];
    pfVar1[0xb] = fVar118 * fVar126 +
                  fVar103 * fVar125 +
                  fVar88 * fVar130 +
                  fVar73 * fVar129 +
                  fVar58 * fVar128 + fVar43 * fVar127 + fVar28 * fVar10 + pfVar1[0xb];
    pfVar1[0xc] = fVar119 * fVar126 +
                  fVar104 * fVar125 +
                  fVar89 * fVar130 +
                  fVar74 * fVar129 +
                  fVar59 * fVar128 + fVar44 * fVar127 + fVar29 * fVar10 + pfVar1[0xc];
    pfVar1[0xd] = fVar120 * fVar126 +
                  fVar105 * fVar125 +
                  fVar90 * fVar130 +
                  fVar75 * fVar129 +
                  fVar60 * fVar128 + fVar45 * fVar127 + fVar30 * fVar10 + pfVar1[0xd];
    pfVar1[0xe] = fVar121 * fVar126 +
                  fVar106 * fVar125 +
                  fVar91 * fVar130 +
                  fVar76 * fVar129 +
                  fVar61 * fVar128 + fVar46 * fVar127 + fVar31 * fVar10 + pfVar1[0xe];
    pfVar1[0xf] = fVar122 * fVar126 +
                  fVar107 * fVar125 +
                  fVar92 * fVar130 +
                  fVar77 * fVar129 +
                  fVar62 * fVar128 + fVar47 * fVar127 + fVar32 * fVar10 + pfVar1[0xf];
    lVar123 = lVar123 + 0x40;
  }
  for (; pfVar1 = (float *)((long)outputp + lVar123), 0xf < lVar124; lVar124 = lVar124 + -0x10) {
    pfVar2 = (float *)((long)pfVar11 + lVar123);
    fVar18 = pfVar2[1];
    fVar19 = pfVar2[2];
    fVar20 = pfVar2[3];
    pfVar3 = (float *)((long)pfVar12 + lVar123);
    fVar21 = pfVar3[1];
    fVar22 = pfVar3[2];
    fVar23 = pfVar3[3];
    pfVar4 = (float *)((long)pfVar13 + lVar123);
    fVar24 = pfVar4[1];
    fVar25 = pfVar4[2];
    fVar26 = pfVar4[3];
    pfVar5 = (float *)((long)pfVar14 + lVar123);
    fVar27 = pfVar5[1];
    fVar28 = pfVar5[2];
    fVar29 = pfVar5[3];
    pfVar6 = (float *)((long)pfVar15 + lVar123);
    fVar30 = pfVar6[1];
    fVar31 = pfVar6[2];
    fVar32 = pfVar6[3];
    pfVar7 = (float *)((long)pfVar16 + lVar123);
    fVar33 = pfVar7[1];
    fVar34 = pfVar7[2];
    fVar35 = pfVar7[3];
    pfVar8 = (float *)((long)pfVar17 + lVar123);
    fVar36 = pfVar8[1];
    fVar37 = pfVar8[2];
    fVar38 = pfVar8[3];
    *pfVar1 = *pfVar8 * fVar126 +
              *pfVar7 * fVar125 +
              *pfVar6 * fVar130 +
              *pfVar5 * fVar129 + *pfVar4 * fVar128 + *pfVar3 * fVar127 + *pfVar2 * fVar10 + *pfVar1
    ;
    pfVar1[1] = fVar36 * fVar126 +
                fVar33 * fVar125 +
                fVar30 * fVar130 +
                fVar27 * fVar129 + fVar24 * fVar128 + fVar21 * fVar127 + fVar18 * fVar10 + pfVar1[1]
    ;
    pfVar1[2] = fVar37 * fVar126 +
                fVar34 * fVar125 +
                fVar31 * fVar130 +
                fVar28 * fVar129 + fVar25 * fVar128 + fVar22 * fVar127 + fVar19 * fVar10 + pfVar1[2]
    ;
    pfVar1[3] = fVar38 * fVar126 +
                fVar35 * fVar125 +
                fVar32 * fVar130 +
                fVar29 * fVar129 + fVar26 * fVar128 + fVar23 * fVar127 + fVar20 * fVar10 + pfVar1[3]
    ;
    lVar123 = lVar123 + 0x10;
  }
  for (lVar124 = 0; (float *)((long)pfVar11 + lVar124 + lVar123) < input0_end; lVar124 = lVar124 + 4
      ) {
    *(float *)((long)outputp + lVar123 + lVar124) =
         *(float *)((long)pfVar17 + lVar123 + lVar124) * fVar126 +
         *(float *)((long)pfVar15 + lVar123 + lVar124) * fVar130 +
         *(float *)((long)pfVar13 + lVar123 + lVar124) * fVar128 +
         *(float *)((long)pfVar11 + lVar123 + lVar124) * fVar10 +
         *(float *)((long)outputp + lVar123 + lVar124) +
         *(float *)((long)pfVar12 + lVar123 + lVar124) * fVar127 +
         *(float *)((long)pfVar14 + lVar123 + lVar124) * fVar129 +
         *(float *)((long)pfVar16 + lVar123 + lVar124) * fVar125;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}